

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall
HdlcAnalyzer::ProcessInformationField
          (HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *information)

{
  byte bVar1;
  bool bVar2;
  pointer pHVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Frame frame;
  U64 local_78;
  U64 UStack_70;
  ulong local_68;
  ulong local_60;
  undefined1 local_58;
  byte local_57;
  U64 local_48;
  U64 UStack_40;
  
  pHVar3 = (information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar3) {
    uVar5 = 1;
    uVar6 = 0;
    do {
      bVar1 = pHVar3[uVar6].value;
      bVar2 = pHVar3[uVar6].escaped;
      local_48 = pHVar3[uVar6].startSample;
      UStack_40 = pHVar3[uVar6].endSample;
      Frame::Frame((Frame *)&local_78);
      local_78 = local_48;
      UStack_70 = UStack_40;
      local_58 = 5;
      local_68 = (ulong)bVar1;
      local_60 = uVar6;
      local_57 = bVar2 & 1;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,(Frame *)&local_78)
      ;
      Frame::~Frame((Frame *)&local_78);
      uVar6 = (ulong)uVar5;
      pHVar3 = (information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) * -0x5555555555555555;
      uVar5 = uVar5 + 1;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessInformationField( const vector<HdlcByte>& information )
{
    for( U32 i = 0; i < information.size(); ++i )
    {
        HdlcByte byte = information.at( i );
        U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_INFORMATION, byte.startSample, byte.endSample, byte.value, i, flag );
        AddFrameToResults( frame );
    }
}